

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void RunMemoryToRegister(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  uint *this;
  VariableData *container;
  TypeBase *pTVar1;
  VmConstant *pVVar2;
  VmBlock *pVVar3;
  VmInstruction *pVVar4;
  VmInstruction *this_00;
  VmValue *pVVar5;
  ArrayView<VmInstruction_*> phiNodes_00;
  bool bVar6;
  SynBase *pSVar7;
  VariableData **ppVVar8;
  VmConstant **ppVVar9;
  VmValue **ppVVar10;
  VmBlock **ppVVar11;
  VmInstruction **ppVVar12;
  int iVar13;
  uint predecessorPos;
  ulong uVar14;
  uint uVar15;
  VmValue *pVVar16;
  VmInstructionType in_R9D;
  uint worklistPos;
  uint index;
  VmValueType index_00;
  uint containerUserPos;
  uint uVar17;
  SmallArray<VmValue_*,_4U> *this_01;
  uint dfPos;
  SmallArray<VmValue_*,_8U> *val;
  VmType VVar18;
  VmType type;
  VmInstruction *phi;
  SynBase *local_4e0;
  ulong local_4d8;
  VmFunction *local_4d0;
  SynBase **local_4c8;
  ScopeData *local_4c0;
  SmallArray<VariableData_*,_4U> *local_4b8;
  SmallArray<VmConstant_*,_8U> *local_4b0;
  TypeBase *local_4a8;
  VmInstruction **local_4a0;
  uint uStack_498;
  undefined4 uStack_494;
  SmallArray<VmInstruction_*,_32U> unusedPhiNodes;
  SmallArray<VmValue_*,_32U> stack;
  SmallArray<VmBlock_*,_32U> worklist;
  SmallArray<VmInstruction_*,_32U> phiNodes;
  
  if ((((value != (VmValue *)0x0) && (value->typeID == 4)) && (value[1].source != (SynBase *)0x0))
     && (value[1]._vptr_VmValue != (_func_int **)0x0)) {
    VmFunction::UpdateDominatorTree((VmFunction *)value,module,true);
    VVar18.structType = local_4a8;
    VVar18._0_8_ = local_4e0;
    local_4c0 = *(ScopeData **)&value[1].typeID;
    if ((local_4c0 != (ScopeData *)0x0) && (local_4c0 != ctx->globalScope)) {
      local_4c8 = &value[1].source;
      for (pSVar7 = (SynBase *)local_4c8; pSVar7 = (SynBase *)pSVar7->_vptr_SynBase,
          pSVar7 != (SynBase *)0x0; pSVar7 = pSVar7 + 3) {
        pSVar7[7].pos.end = (char *)0x0;
      }
      local_4b8 = &local_4c0->allVariables;
      local_4d0 = (VmFunction *)value;
      for (uVar14 = 0; local_4a8 = VVar18.structType, local_4e0 = VVar18._0_8_,
          (uint)uVar14 < (local_4c0->allVariables).count; uVar14 = (ulong)((int)uVar14 + 1)) {
        ppVVar8 = SmallArray<VariableData_*,_4U>::operator[](local_4b8,(uint)uVar14);
        VVar18.structType = local_4a8;
        VVar18._0_8_ = local_4e0;
        container = *ppVVar8;
        if ((container->isAlloca != true) || ((container->users).count != 0)) {
          bVar6 = IsMemberScope(container->scope);
          if (bVar6) {
            __assert_fail("!IsMemberScope(variable->scope)",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x17c0,
                          "void RunMemoryToRegister(ExpressionContext &, VmModule *, VmValue *)");
          }
          bVar6 = IsGlobalScope(container->scope);
          if (bVar6) {
            __assert_fail("!IsGlobalScope(variable->scope)",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x17c1,
                          "void RunMemoryToRegister(ExpressionContext &, VmModule *, VmValue *)");
          }
          bVar6 = HasAddressTaken(container);
          VVar18.structType = local_4a8;
          VVar18._0_8_ = local_4e0;
          if (!bVar6) {
            local_4d8 = uVar14;
            VVar18 = GetVmType(ctx,container->type);
            uVar14 = local_4d8;
            local_4a8 = VVar18.structType;
            pTVar1 = container->type;
            if (((pTVar1 == ctx->typeInt) || (pTVar1 == ctx->typeDouble)) ||
               (local_4e0._0_4_ = VVar18.type,
               pTVar1 == ctx->typeLong || (VmValueType)local_4e0 == VM_TYPE_POINTER)) {
              worklist.allocator = module->allocator;
              worklist.data = worklist.little;
              worklist.count = 0;
              worklist.max = 0x20;
              local_4e0 = VVar18._0_8_;
              bVar6 = IsArgumentVariable(((VmFunction *)value)->function,container);
              iVar13 = (int)uVar14 + 1;
              if (bVar6) {
                *(int *)&(*local_4c8)[7].pos.end = iVar13;
                SmallArray<VmBlock_*,_32U>::push_back(&worklist,(VmBlock **)local_4c8);
              }
              local_4b0 = &container->users;
              for (uVar15 = 0; uVar15 < (container->users).count; uVar15 = uVar15 + 1) {
                ppVVar9 = SmallArray<VmConstant_*,_8U>::operator[](local_4b0,uVar15);
                pVVar2 = *ppVVar9;
                for (uVar17 = 0; uVar17 < (pVVar2->super_VmValue).users.count; uVar17 = uVar17 + 1)
                {
                  ppVVar10 = SmallArray<VmValue_*,_8U>::operator[]
                                       (&(pVVar2->super_VmValue).users,uVar17);
                  pVVar16 = *ppVVar10;
                  if (((pVVar16 != (VmValue *)0x0) && (pVVar16->typeID == 2)) &&
                     (*(int *)&pVVar16[1]._vptr_VmValue - 8U < 7)) {
                    ppVVar10 = SmallArray<VmValue_*,_4U>::operator[]
                                         ((SmallArray<VmValue_*,_4U> *)&pVVar16[1].typeID,0);
                    if ((VmConstant *)*ppVVar10 == pVVar2) {
                      val = &pVVar16[1].users;
                      index = 0;
                      bVar6 = false;
                      while ((index < worklist.count && (!bVar6))) {
                        ppVVar11 = SmallArray<VmBlock_*,_32U>::operator[](&worklist,index);
                        index = index + 1;
                        bVar6 = *ppVVar11 == (VmBlock *)val->data;
                      }
                      if (!bVar6) {
                        *(int *)(val->data + 0x3d) = iVar13;
                        SmallArray<VmBlock_*,_32U>::push_back(&worklist,(VmBlock **)val);
                      }
                    }
                  }
                }
                uVar14 = local_4d8;
              }
              module->currentFunction = local_4d0;
              phiNodes.allocator = module->allocator;
              phiNodes.data = phiNodes.little;
              phiNodes.count = 0;
              phiNodes.max = 0x20;
              while (worklist.count != 0) {
                ppVVar11 = SmallArray<VmBlock_*,_32U>::back(&worklist);
                pVVar3 = *ppVVar11;
                SmallArray<VmBlock_*,_32U>::pop_back(&worklist);
                for (uVar15 = 0; uVar15 < (pVVar3->dominanceFrontier).count; uVar15 = uVar15 + 1) {
                  ppVVar11 = SmallArray<VmBlock_*,_4U>::operator[]
                                       (&pVVar3->dominanceFrontier,uVar15);
                  stack.data = (VmValue **)*ppVVar11;
                  if (((VmBlock *)stack.data)->hasPhiNodeForId <= (uint)uVar14) {
                    module->currentBlock = (VmBlock *)stack.data;
                    ((VmBlock *)stack.data)->insertPoint = (VmInstruction *)0x0;
                    type.structType = (TypeBase *)0x4d;
                    type._0_8_ = local_4a8;
                    unusedPhiNodes.data =
                         (VmInstruction **)
                         anon_unknown.dwarf_20a43d::CreateInstruction
                                   ((anon_unknown_dwarf_20a43d *)module,(VmModule *)0x0,local_4e0,
                                    type,in_R9D);
                    for (uVar17 = 0; uVar17 < *(uint *)(stack.data + 0x1e); uVar17 = uVar17 + 1) {
                      phi = (VmInstruction *)0x0;
                      SmallArray<VmValue_*,_4U>::push_back
                                ((SmallArray<VmValue_*,_4U> *)(unusedPhiNodes.data + 0x14),
                                 (VmValue **)&phi);
                      this_01 = (SmallArray<VmValue_*,_4U> *)(unusedPhiNodes.data + 0x14);
                      ppVVar11 = SmallArray<VmBlock_*,_4U>::operator[]
                                           ((SmallArray<VmBlock_*,_4U> *)(stack.data + 0x1d),uVar17)
                      ;
                      phi = (VmInstruction *)*ppVVar11;
                      SmallArray<VmValue_*,_4U>::push_back(this_01,(VmValue **)&phi);
                      ppVVar11 = SmallArray<VmBlock_*,_4U>::operator[]
                                           ((SmallArray<VmBlock_*,_4U> *)(stack.data + 0x1d),uVar17)
                      ;
                      VmValue::AddUse(&(*ppVVar11)->super_VmValue,(VmValue *)unusedPhiNodes.data);
                    }
                    pVVar4 = (VmInstruction *)(container->name->name).end;
                    unusedPhiNodes.data[5] = (VmInstruction *)(container->name->name).begin;
                    unusedPhiNodes.data[6] = pVVar4;
                    SmallArray<VmInstruction_*,_32U>::push_back
                              (&phiNodes,(VmInstruction **)&unusedPhiNodes);
                    uVar14 = local_4d8;
                    stack.data[0x1b] = stack.data[0x1a];
                    module->currentBlock = (VmBlock *)0x0;
                    *(int *)((long)stack.data + 0x1ec) = iVar13;
                    if (*(uint *)(stack.data + 0x3d) <= (uint)local_4d8) {
                      *(int *)(stack.data + 0x3d) = iVar13;
                      SmallArray<VmBlock_*,_32U>::push_back(&worklist,(VmBlock **)&stack);
                    }
                  }
                }
              }
              stack.allocator = module->allocator;
              stack.data = stack.little;
              stack.count = 0;
              stack.max = 0x20;
              local_4a0 = phiNodes.data;
              uStack_498 = phiNodes.count;
              phiNodes_00._12_4_ = uStack_494;
              phiNodes_00.count = phiNodes.count;
              phiNodes_00.data = phiNodes.data;
              RenameMemoryToRegister(ctx,module,(VmBlock *)*local_4c8,&stack,container,phiNodes_00);
              value = &local_4d0->super_VmValue;
              unusedPhiNodes.allocator = module->allocator;
              unusedPhiNodes.data = unusedPhiNodes.little;
              unusedPhiNodes.count = 0;
              unusedPhiNodes.max = 0x20;
              for (uVar15 = 0; uVar15 < phiNodes.count; uVar15 = uVar15 + 1) {
                ppVVar12 = SmallArray<VmInstruction_*,_32U>::operator[](&phiNodes,uVar15);
                phi = *ppVVar12;
                uVar17 = ((VmFunction *)value)->nextSearchMarker;
                ((VmFunction *)value)->nextSearchMarker = uVar17 + 1;
                bVar6 = IsPhiUsed(phi,uVar17);
                if (!bVar6) {
                  SmallArray<VmInstruction_*,_32U>::push_back(&unusedPhiNodes,&phi);
                }
              }
              uVar15 = 0;
              while (uVar15 < unusedPhiNodes.count) {
                local_4e0 = (SynBase *)CONCAT44(local_4e0._4_4_,uVar15);
                ppVVar12 = SmallArray<VmInstruction_*,_32U>::operator[](&unusedPhiNodes,uVar15);
                pVVar4 = *ppVVar12;
                (pVVar4->super_VmValue).canBeRemoved = false;
                while ((pVVar4->super_VmValue).users.count != 0) {
                  ppVVar10 = SmallArray<VmValue_*,_8U>::back(&(pVVar4->super_VmValue).users);
                  pVVar16 = *ppVVar10;
                  if ((pVVar16 == (VmValue *)0x0) || (pVVar16->typeID != 2)) {
                    pVVar16 = (VmValue *)0x0;
                  }
                  if (*(int *)&pVVar16[1]._vptr_VmValue != 0x4d) {
                    __assert_fail("user->cmd == VM_INST_PHI",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                                  ,0x183e,
                                  "void RunMemoryToRegister(ExpressionContext &, VmModule *, VmValue *)"
                                 );
                  }
                  this = &pVVar16[1].typeID;
                  for (uVar15 = 1; index_00 = uVar15 - VM_TYPE_INT, index_00 < pVVar16[1].type.type;
                      uVar15 = uVar15 + 2) {
                    ppVVar10 = SmallArray<VmValue_*,_4U>::operator[]
                                         ((SmallArray<VmValue_*,_4U> *)this,index_00);
                    this_00 = (VmInstruction *)*ppVVar10;
                    ppVVar10 = SmallArray<VmValue_*,_4U>::operator[]
                                         ((SmallArray<VmValue_*,_4U> *)this,uVar15);
                    if (this_00 == pVVar4) {
                      pVVar5 = *ppVVar10;
                      VmValue::RemoveUse((VmValue *)this_00,pVVar16);
                      VmValue::RemoveUse(pVVar5,pVVar16);
                      ppVVar10 = SmallArray<VmValue_*,_4U>::operator[]
                                           ((SmallArray<VmValue_*,_4U> *)this,
                                            pVVar16[1].type.type - VM_TYPE_DOUBLE);
                      pVVar5 = *ppVVar10;
                      ppVVar10 = SmallArray<VmValue_*,_4U>::operator[]
                                           ((SmallArray<VmValue_*,_4U> *)this,index_00);
                      *ppVVar10 = pVVar5;
                      ppVVar10 = SmallArray<VmValue_*,_4U>::operator[]
                                           ((SmallArray<VmValue_*,_4U> *)this,
                                            pVVar16[1].type.type - VM_TYPE_INT);
                      pVVar5 = *ppVVar10;
                      ppVVar10 = SmallArray<VmValue_*,_4U>::operator[]
                                           ((SmallArray<VmValue_*,_4U> *)this,uVar15);
                      *ppVVar10 = pVVar5;
                      SmallArray<VmValue_*,_4U>::pop_back((SmallArray<VmValue_*,_4U> *)this);
                      SmallArray<VmValue_*,_4U>::pop_back((SmallArray<VmValue_*,_4U> *)this);
                    }
                  }
                }
                (pVVar4->super_VmValue).canBeRemoved = true;
                uVar15 = (VmValueType)local_4e0 + 1;
                value = &local_4d0->super_VmValue;
              }
              module->currentFunction = (VmFunction *)0x0;
              SmallArray<VmInstruction_*,_32U>::~SmallArray(&unusedPhiNodes);
              SmallArray<VmValue_*,_32U>::~SmallArray(&stack);
              SmallArray<VmInstruction_*,_32U>::~SmallArray(&phiNodes);
              SmallArray<VmBlock_*,_32U>::~SmallArray(&worklist);
              VVar18.structType = local_4a8;
              VVar18._0_8_ = local_4e0;
              uVar14 = local_4d8;
            }
          }
        }
      }
      VmFunction::UpdateLiveSets((VmFunction *)value,module);
    }
  }
  return;
}

Assistant:

void RunMemoryToRegister(ExpressionContext &ctx, VmModule *module, VmValue* value)
{
	if(VmFunction *function = getType<VmFunction>(value))
	{
		// Skip prototypes
		if(!function->firstBlock)
			return;

		// Skip global code
		if(!function->function)
			return;

		// Prepare dominator frontier data
		function->UpdateDominatorTree(module, true);

		ScopeData *scope = function->scope;

		if(!scope)
			return;

		// Keep stores to globals
		if(scope == ctx.globalScope)
			return;

		for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
		{
			curr->hasAssignmentForId = 0;
			curr->hasPhiNodeForId = 0;
		}

		for(unsigned i = 0; i < scope->allVariables.size(); i++)
		{
			VariableData *variable = scope->allVariables[i];

			if(variable->isAlloca && variable->users.empty())
				continue;

			assert(!IsMemberScope(variable->scope));
			assert(!IsGlobalScope(variable->scope));

			// Consider only the variables that don't have their address taken
			if(HasAddressTaken(variable))
				continue;

			// Consider only variables of simple types
			VmType vmType = GetVmType(ctx, variable->type);

			if(variable->type != ctx.typeInt && variable->type != ctx.typeDouble && variable->type != ctx.typeLong && vmType.type != VM_TYPE_POINTER)
				continue;

			// Initilize the worklist with a set of blocks that contain assignments to the variable
			SmallArray<VmBlock*, 32> worklist(module->allocator);

			// Argument is implicitly initialized in the entry block
			if(IsArgumentVariable(function->function, variable))
			{
				function->firstBlock->hasAssignmentForId = i + 1;
				worklist.push_back(function->firstBlock);
			}

			// Find all explicit assignments
			for(unsigned varUserPos = 0; varUserPos < variable->users.size(); varUserPos++)
			{
				VmConstant *user = variable->users[varUserPos];

				for(unsigned containerUserPos = 0; containerUserPos < user->users.size(); containerUserPos++)
				{
					if(VmInstruction *inst = getType<VmInstruction>(user->users[containerUserPos]))
					{
						if(inst->cmd >= VM_INST_STORE_BYTE && inst->cmd <= VM_INST_STORE_STRUCT && inst->arguments[0] == user)
						{
							bool found = false;

							for(unsigned worklistPos = 0; worklistPos < worklist.size() && !found; worklistPos++)
							{
								if(worklist[worklistPos] == inst->parent)
									found = true;
							}

							if(!found)
							{
								inst->parent->hasAssignmentForId = i + 1;
								worklist.push_back(inst->parent);
							}
						}
					}
				}
			}

			module->currentFunction = function;

			// Add placeholders for required phi nodes
			SmallArray<VmInstruction*, 32> phiNodes(module->allocator);

			while(!worklist.empty())
			{
				VmBlock *block = worklist.back();
				worklist.pop_back();

				for(unsigned dfPos = 0; dfPos < block->dominanceFrontier.size(); dfPos++)
				{
					VmBlock *dominator = block->dominanceFrontier[dfPos];

					if(dominator->hasPhiNodeForId < i + 1)
					{
						// Add phi for variable
						module->currentBlock = dominator;
						dominator->insertPoint = NULL;

						VmInstruction *placeholder = CreateInstruction(module, NULL, vmType, VM_INST_PHI);

						for(unsigned predecessorPos = 0; predecessorPos < dominator->predecessors.size(); predecessorPos++)
						{
							placeholder->arguments.push_back(NULL);
							placeholder->arguments.push_back(dominator->predecessors[predecessorPos]);

							dominator->predecessors[predecessorPos]->AddUse(placeholder);
						}

						placeholder->comment = variable->name->name;

						phiNodes.push_back(placeholder);

						dominator->insertPoint = dominator->lastInstruction;
						module->currentBlock = NULL;

						dominator->hasPhiNodeForId = i + 1;

						if(dominator->hasAssignmentForId < i + 1)
						{
							dominator->hasAssignmentForId = i + 1;
							worklist.push_back(dominator);
						}
					}
				}
			}

			SmallArray<VmValue*, 32> stack(module->allocator);

			RenameMemoryToRegister(ctx, module, function->firstBlock, stack, variable, phiNodes);

			// Remove dead phi instructions (prune ssa)
			SmallArray<VmInstruction*, 32> unusedPhiNodes(module->allocator);

			for(unsigned k = 0; k < phiNodes.size(); k++)
			{
				VmInstruction *phi = phiNodes[k];

				if(!IsPhiUsed(phi, function->nextSearchMarker++))
					unusedPhiNodes.push_back(phi);
			}

			for(unsigned k = 0; k < unusedPhiNodes.size(); k++)
			{
				VmInstruction *phi = unusedPhiNodes[k];

				phi->canBeRemoved = false;

				// Remove from all phi users (since this is an unused phi node, all remaining users are circular references from other phi nodes)
				while(!phi->users.empty())
				{
					VmInstruction *user = getType<VmInstruction>(phi->users.back());

					assert(user->cmd == VM_INST_PHI);

					for(unsigned argument = 0; argument < user->arguments.size(); argument += 2)
					{
						VmValue *option = user->arguments[argument];
						VmValue *edge = user->arguments[argument + 1];

						if(option == phi)
						{
							option->RemoveUse(user);
							edge->RemoveUse(user);

							user->arguments[argument] = user->arguments[user->arguments.size() - 2];
							user->arguments[argument + 1] = user->arguments[user->arguments.size() - 1];

							user->arguments.pop_back();
							user->arguments.pop_back();
						}
					}
				}

				phi->canBeRemoved = true;
			}

			module->currentFunction = NULL;
		}

		function->UpdateLiveSets(module);
	}
}